

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O0

void set_authentication_config
               (AMQP_DEVICE_INSTANCE_conflict *device_instance,AUTHENTICATION_CONFIG *auth_config)

{
  AMQP_DEVICE_CONFIG *pAVar1;
  AMQP_DEVICE_CONFIG *device_config;
  AUTHENTICATION_CONFIG *auth_config_local;
  AMQP_DEVICE_INSTANCE_conflict *device_instance_local;
  
  pAVar1 = device_instance->config;
  auth_config->device_id = pAVar1->device_id;
  auth_config->module_id = pAVar1->module_id;
  auth_config->iothub_host_fqdn = pAVar1->iothub_host_fqdn;
  auth_config->on_error_callback = on_authentication_error_callback;
  auth_config->on_error_callback_context = device_instance;
  auth_config->on_state_changed_callback = on_authentication_state_changed_callback;
  auth_config->on_state_changed_callback_context = device_instance;
  auth_config->authorization_module = pAVar1->authorization_module;
  return;
}

Assistant:

static void set_authentication_config(AMQP_DEVICE_INSTANCE* device_instance, AUTHENTICATION_CONFIG* auth_config)
{
    AMQP_DEVICE_CONFIG *device_config = device_instance->config;

    auth_config->device_id = device_config->device_id;
    auth_config->module_id = device_config->module_id;
    auth_config->iothub_host_fqdn = device_config->iothub_host_fqdn;
    auth_config->on_error_callback = on_authentication_error_callback;
    auth_config->on_error_callback_context = device_instance;
    auth_config->on_state_changed_callback = on_authentication_state_changed_callback;
    auth_config->on_state_changed_callback_context = device_instance;
    auth_config->authorization_module = device_config->authorization_module;
}